

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_remove_zeroRange_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *expr;
  char *pcVar3;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 0xb;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 0x10;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10dc54;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,0x10);
  builtin_strncpy(array.buffer,"0123456789",0xb);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x10dc8b;
  private_ACUtils_ADynArray_remove(&array,2,0,1);
  if (array.size == 0xb) {
    uStack_50 = 0x10dcaa;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x225);
    if (array.capacity == 0x10) {
      uStack_50 = 0x10dcca;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x226);
      if (array.buffer == (char *)0x0) {
        ppcVar5 = &local_58;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) array.buffer != NULL";
        pcVar7 = "(void*) array.buffer";
        iVar1 = 0x227;
LAB_0010defc:
        uStack_50 = 0;
        local_58 = (char *)0x0;
        *(code **)((long)ppcVar5 + -8) = test_ADynArray_remove_indexBeyoundBounds_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar1,pcVar3,pcVar2,pcVar6,pcVar7);
      }
      uStack_50 = 0x10dce7;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x227);
      pcStack_80 = array.buffer;
      if (array.buffer == (char *)0x0) {
        pcVar2 = "";
        pcStack_80 = "(null)";
      }
      else {
        uStack_50 = 0x10dd04;
        iVar1 = strcmp("0123456789",array.buffer);
        if (iVar1 == 0) {
          uStack_50 = 0x10dd1d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x228);
          if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
            ppcVar5 = &local_58;
            pcVar3 = "Assertion \'_ck_x != NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar6 = "(void*) array.growStrategy != NULL";
            pcVar7 = "(void*) array.growStrategy";
            iVar1 = 0x229;
          }
          else {
            uStack_50 = 0x10dd3a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x229);
            if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
              uStack_50 = 0x10dd5b;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x22a);
              uStack_50 = 0x10dd64;
              (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
              return;
            }
            ppcVar5 = &local_68;
            local_60 = "0";
            local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar1 = 0x22a;
          }
          goto LAB_0010defc;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar7 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar3 = "array.buffer == \"0123456789\"";
      pcVar6 = "array.buffer";
      iVar1 = 0x228;
      local_58 = "\"";
      local_60 = "0123456789";
      local_68 = "\"";
      pcStack_70 = "\"0123456789\"";
      ppcVar4 = &pcStack_80;
      pcStack_78 = pcVar2;
      goto LAB_0010de7c;
    }
    local_60 = "16";
    pcVar3 = "array.capacity == 16";
    pcVar6 = "array.capacity";
    iVar1 = 0x226;
    local_58 = (char *)0x10;
    pcVar2 = (char *)array.capacity;
  }
  else {
    local_60 = "11";
    pcVar3 = "array.size == 11";
    pcVar6 = "array.size";
    iVar1 = 0x225;
    local_58 = (char *)0xb;
    pcVar2 = (char *)array.size;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar7 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar4 = &local_60;
LAB_0010de7c:
  uStack_50 = 0;
  *(char **)((long)ppcVar4 + -8) = pcVar2;
  *(undefined8 *)((long)ppcVar4 + -0x10) = 0x10de83;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar1,expr,pcVar7,pcVar3,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_remove_zeroRange)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 11;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 16;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "0123456789", 11);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ADynArray_remove(&array, 2, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 11);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456789");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}